

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

void set_left_object_offset_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Object local_60;
  int local_54;
  int x;
  int local_44;
  int val;
  int *local_38;
  am_loc_values *loc_values;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object win;
  Am_Object *cmd_local;
  
  win.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(&local_18,0xfa,0);
  local_38 = (int *)Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object
            ((Am_Object *)&stack0xffffffffffffffc0,(Am_Slot_Key)&local_18,(ulong)Am_LEFT_HOW);
  pAVar2 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc0,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  *local_38 = iVar1;
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  local_44 = local_38[6];
  Am_Object::Get_Object
            ((Am_Object *)&stack0xffffffffffffffb0,(Am_Slot_Key)&local_18,
             (ulong)Am_LEFT_AMOUNT_WIDGET);
  Am_Object::Set((Am_Object *)&stack0xffffffffffffffb0,0x169,local_44,0);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffb0);
  set_ref_grey(&local_18,false);
  pAVar2 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  switch(iVar1) {
  case 0xc:
    local_54 = 6;
    break;
  case 0xd:
    local_54 = 0x14;
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar3 = std::operator<<(poVar3,"Bad left control ");
    pAVar2 = Am_Object::Get(cmd,0x169,0);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    this = (void *)std::ostream::operator<<(poVar3,iVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Am_Error();
  case 0xf:
    local_54 = 0x3a;
    break;
  case 0x10:
    local_54 = 0x48;
  }
  Am_Object::Get_Object(&local_60,(Am_Slot_Key)&local_18,(ulong)Am_SHOW_LOC_OBJ);
  Am_Object::Set(&local_60,100,local_54,0);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_left_object_offset,
                 (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  loc_values->left_control = win.Get_Object(Am_LEFT_HOW).Get(Am_VALUE);
  int val = loc_values->left_object_offset;
  win.Get_Object(Am_LEFT_AMOUNT_WIDGET).Set(Am_VALUE, val);
  set_ref_grey(win, false);
  int x;
  switch ((int)cmd.Get(Am_VALUE)) {
  case am_change_offset_left_outside:
    x = REF_OBJ_LEFT - SHOW_LOC_OBJ_SIZE - 1;
    break;
  case am_change_offset_left_inside:
    x = REF_OBJ_LEFT + SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_right_inside:
    x = REF_OBJ_LEFT + REF_OBJ_SIZE - SHOW_LOC_OBJ_SIZE - SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_right_outside:
    x = REF_OBJ_LEFT + REF_OBJ_SIZE + 1;
    break;
  default:
    Am_ERROR("Bad left control " << (int)cmd.Get(Am_VALUE));
  }
  win.Get_Object(Am_SHOW_LOC_OBJ).Set(Am_LEFT, x);
}